

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodeSetPtr xmlXPathLeading(xmlNodeSetPtr nodes1,xmlNodeSetPtr nodes2)

{
  xmlNodePtr local_30;
  xmlNodeSetPtr nodes2_local;
  xmlNodeSetPtr nodes1_local;
  
  nodes1_local = nodes1;
  if (((nodes2 != (xmlNodeSetPtr)0x0) && (nodes2->nodeNr != 0)) &&
     (nodes2->nodeTab != (xmlNodePtr *)0x0)) {
    if (((nodes1 == (xmlNodeSetPtr)0x0) || (nodes1->nodeNr == 0)) ||
       (nodes1->nodeTab == (xmlNodePtr *)0x0)) {
      nodes1_local = xmlXPathNodeSetCreate((xmlNodePtr)0x0);
    }
    else {
      xmlXPathNodeSetSort(nodes1);
      xmlXPathNodeSetSort(nodes2);
      if ((nodes2 == (xmlNodeSetPtr)0x0) || (nodes2->nodeNr < 2)) {
        local_30 = (xmlNodePtr)0x0;
      }
      else {
        local_30 = nodes2->nodeTab[1];
      }
      nodes1_local = xmlXPathNodeLeadingSorted(nodes1,local_30);
    }
  }
  return nodes1_local;
}

Assistant:

xmlNodeSetPtr
xmlXPathLeading (xmlNodeSetPtr nodes1, xmlNodeSetPtr nodes2) {
    if (xmlXPathNodeSetIsEmpty(nodes2))
	return(nodes1);
    if (xmlXPathNodeSetIsEmpty(nodes1))
	return(xmlXPathNodeSetCreate(NULL));
    xmlXPathNodeSetSort(nodes1);
    xmlXPathNodeSetSort(nodes2);
    return(xmlXPathNodeLeadingSorted(nodes1,
				     xmlXPathNodeSetItem(nodes2, 1)));
}